

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

unit_data __thiscall units::detail::unit_data::operator/(unit_data *this,unit_data *other)

{
  unit_data *other_local;
  unit_data *this_local;
  
  unit_data((unit_data *)((long)&this_local + 4),
            (((int)*this << 0x1c) >> 0x1c) - (((int)*other << 0x1c) >> 0x1c),
            (((int)*this << 0x15) >> 0x1d) - (((int)*other << 0x15) >> 0x1d),
            (((int)*this << 0x18) >> 0x1c) - (((int)*other << 0x18) >> 0x1c),
            (((int)*this << 0x12) >> 0x1d) - (((int)*other << 0x12) >> 0x1d),
            (((int)*this << 0xd) >> 0x1d) - (((int)*other << 0xd) >> 0x1d),
            (((int)*this << 0xb) >> 0x1e) - (((int)*other << 0xb) >> 0x1e),
            (((int)*this << 0x10) >> 0x1e) - (((int)*other << 0x10) >> 0x1e),
            (((int)*this << 6) >> 0x1e) - (((int)*other << 6) >> 0x1e),
            (((int)*this << 4) >> 0x1e) - (((int)*other << 4) >> 0x1e),
            (((int)*this << 8) >> 0x1d) - (((int)*other << 8) >> 0x1d),
            (uint)*this >> 0x1c & 1 | (uint)*other >> 0x1c & 1,
            (uint)*this >> 0x1d & 1 ^ (uint)*other >> 0x1d & 1,
            (uint)*this >> 0x1e & 1 ^ (uint)*other >> 0x1e & 1,((uint)*this | (uint)*other) >> 0x1f)
  ;
  return this_local._4_4_;
}

Assistant:

constexpr unit_data operator/(const unit_data& other) const
        {
            return {
                meter_ - other.meter_,
                kilogram_ - other.kilogram_,
                second_ - other.second_,
                ampere_ - other.ampere_,
                kelvin_ - other.kelvin_,
                mole_ - other.mole_,
                candela_ - other.candela_,
                currency_ - other.currency_,
                count_ - other.count_,
                radians_ - other.radians_,
                static_cast<unsigned int>(per_unit_ | other.per_unit_),
                static_cast<unsigned int>(i_flag_ ^ other.i_flag_),
                static_cast<unsigned int>(e_flag_ ^ other.e_flag_),
                static_cast<unsigned int>(equation_ | other.equation_),
            };
        }